

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O1

void mbedtls_set_alarm(int seconds)

{
  mbedtls_timing_alarmed = 0;
  signal(0xe,sighandler);
  alarm(seconds);
  if (seconds == 0) {
    mbedtls_timing_alarmed = 1;
  }
  return;
}

Assistant:

void mbedtls_set_alarm( int seconds )
{
    mbedtls_timing_alarmed = 0;
    signal( SIGALRM, sighandler );
    alarm( seconds );
    if( seconds == 0 )
    {
        /* alarm(0) cancelled any previous pending alarm, but the
           handler won't fire, so raise the flag straight away. */
        mbedtls_timing_alarmed = 1;
    }
}